

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageview.cpp
# Opt level: O1

void __thiscall QtMWidgets::PageViewPrivate::layoutControl(PageViewPrivate *this,QRect *r)

{
  QSize controlSize;
  
  (**(code **)(*(long *)this->control + 0x80))(this->control,(r->x2 - r->x1) + 1);
  QWidget::resize((QSize *)this->control);
  QWidget::move((QPoint *)this->control);
  return;
}

Assistant:

void
PageViewPrivate::layoutControl( const QRect & r )
{
	const QSize controlSize = QSize( r.width(),
		control->heightForWidth( r.width() ) );

	const int y = r.bottomLeft().y() - controlOffset - controlSize.height();

	control->resize( controlSize );

	control->move( r.topLeft().x(), y );
}